

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# playmidi.cpp
# Opt level: O0

void __thiscall Timidity::Renderer::DataEntryCoarseRPN(Renderer *this,int chan,int rpn,int val)

{
  int val_local;
  int rpn_local;
  int chan_local;
  Renderer *this_local;
  
  if (rpn == 0) {
    this->channel[chan].pitchsens = this->channel[chan].pitchsens % 100 + val * 100;
    this->channel[chan].pitchfactor = 0.0;
  }
  return;
}

Assistant:

void Renderer::DataEntryCoarseRPN(int chan, int rpn, int val)
{
	switch (rpn)
	{
	case RPN_PITCH_SENS:
		channel[chan].pitchsens = (channel[chan].pitchsens % 100) + (val * 100);
		channel[chan].pitchfactor = 0;
		break;

	// TiMidity resets the pitch sensitivity when a song attempts to write to
	// RPN_RESET. My docs tell me this is just a dummy value that is guaranteed
	// to not cause future data entry to go anywhere until a new RPN is set.
	}
}